

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilMisc.c
# Opt level: O0

uint ** Extra_TruthPerm63(void)

{
  uint auVar1 [2];
  int local_20;
  uint local_1c;
  int k;
  int i;
  uint uTruth [2];
  uint **pTable;
  
  uTruth = (uint  [2])Extra_ArrayAlloc(0x100,0x40,8);
  for (local_1c = 0; (int)local_1c < 0x100; local_1c = local_1c + 1) {
    k = local_1c << 0x18 | local_1c << 0x10 | local_1c << 8 | local_1c;
    i = k;
    for (local_20 = 0; local_20 < 0x40; local_20 = local_20 + 1) {
      Extra_TruthPerm6One((uint *)&k,local_20,
                          (uint *)(*(long *)((long)uTruth + (long)(int)local_1c * 8) +
                                  (long)local_20 * 4));
    }
  }
  auVar1[0] = uTruth[0];
  auVar1[1] = uTruth[1];
  return (uint **)auVar1;
}

Assistant:

unsigned ** Extra_TruthPerm63()
{
    unsigned ** pTable;
    unsigned uTruth[2];
    int i, k;
    pTable = (unsigned **)Extra_ArrayAlloc( 256, 64, 8 );
    for ( i = 0; i < 256; i++ )
    {
        uTruth[0] = (i << 24) | (i << 16) | (i << 8) | i;
        uTruth[1] = uTruth[0];
        for ( k = 0; k < 64; k++ )
            Extra_TruthPerm6One( uTruth, k, &pTable[i][k] );
    }
    return pTable;
}